

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_dir.c
# Opt level: O0

void print_entry(ALLEGRO_FS_ENTRY *entry)

{
  uint uVar1;
  ulong uVar2;
  undefined8 uVar3;
  ALLEGRO_FS_ENTRY *entry_00;
  undefined8 in_RDI;
  ALLEGRO_FS_ENTRY *next;
  ALLEGRO_FS_ENTRY *in_stack_00000048;
  
  print_file(in_stack_00000048);
  uVar1 = al_get_fs_entry_mode(in_RDI);
  if ((uVar1 & 0x20) != 0) {
    uVar2 = al_open_directory(in_RDI);
    if ((uVar2 & 1) == 0) {
      uVar3 = al_get_fs_entry_name(in_RDI);
      log_printf("Error opening directory: %s\n",uVar3);
    }
    else {
      while (entry_00 = (ALLEGRO_FS_ENTRY *)al_read_directory(in_RDI),
            entry_00 != (ALLEGRO_FS_ENTRY *)0x0) {
        print_entry(entry_00);
        al_destroy_fs_entry(entry_00);
      }
      al_close_directory(in_RDI);
    }
  }
  return;
}

Assistant:

static void print_entry(ALLEGRO_FS_ENTRY *entry)
{
   ALLEGRO_FS_ENTRY *next;

   print_file(entry);

   if (!(al_get_fs_entry_mode(entry) & ALLEGRO_FILEMODE_ISDIR))
      return;

   if (!al_open_directory(entry)) {
      log_printf("Error opening directory: %s\n", al_get_fs_entry_name(entry));
      return;
   }

   while (1) {
      next = al_read_directory(entry);
      if (!next)
         break;

      print_entry(next);
      al_destroy_fs_entry(next);
   }

   al_close_directory(entry);
}